

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomNative.cpp
# Opt level: O0

PackageInfo * chatra::emb::random::packageInfo(void)

{
  allocator<chatra::Script> *this;
  initializer_list<chatra::NativeCallHandlerInfo> __l;
  initializer_list<chatra::Script> __l_00;
  undefined *puVar1;
  PackageInfo *in_RDI;
  NativeCallHandlerInfo *local_348;
  Script *local_300;
  allocator<chatra::NativeCallHandlerInfo> local_2bb;
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  NativeCallHandlerInfo *local_248;
  NativeCallHandlerInfo local_240;
  NativeCallHandlerInfo local_1d8;
  NativeCallHandlerInfo local_170;
  undefined1 local_108 [24];
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  string local_d8;
  allocator local_a1;
  string local_a0;
  Script *local_80;
  Script local_78;
  Script *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"random",&local_a1);
  puVar1 = script;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,puVar1,
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Script::Script(&local_78,&local_a0,&local_d8);
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_30 = 1;
  this = (allocator<chatra::Script> *)
         ((long)&handlers.
                 super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  local_38 = &local_78;
  std::allocator<chatra::Script>::allocator(this);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28,__l_00,this);
  std::allocator<chatra::Script>::~allocator
            ((allocator<chatra::Script> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_300 = (Script *)&local_38;
  do {
    local_300 = local_300 + -1;
    Script::~Script(local_300);
  } while (local_300 != &local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_2ba = 1;
  local_248 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"_native_comply",&local_269);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_240,comply,&local_268);
  local_248 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"_native_convert",&local_291);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1d8,convert,&local_290);
  local_248 = &local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"_native_systemRandom",&local_2b9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_170,systemRandom,&local_2b8);
  local_2ba = 0;
  local_108._0_8_ = &local_240;
  local_108._8_8_ = 3;
  std::allocator<chatra::NativeCallHandlerInfo>::allocator(&local_2bb);
  __l._M_len = local_108._8_8_;
  __l._M_array = (iterator)local_108._0_8_;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10),__l,&local_2bb);
  std::allocator<chatra::NativeCallHandlerInfo>::~allocator(&local_2bb);
  local_348 = (NativeCallHandlerInfo *)local_108;
  do {
    local_348 = local_348 + -1;
    NativeCallHandlerInfo::~NativeCallHandlerInfo(local_348);
  } while (local_348 != &local_240);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10));
  std::shared_ptr<chatra::IPackage>::shared_ptr(&in_RDI->interface,(nullptr_t)0x0);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          (local_108 + 0x10));
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"random", script}};
	std::vector<HandlerInfo> handlers = {
			{comply, "_native_comply"},
			{convert, "_native_convert"},
			{systemRandom, "_native_systemRandom"},
	};
	return {scripts, handlers, nullptr};
}